

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O3

UnicodeString *
icu_63::MessageImpl::appendSubMessageWithoutSkipSyntax
          (MessagePattern *msgPattern,int32_t msgStart,UnicodeString *result)

{
  UMessagePatternPartType UVar1;
  int start;
  UnicodeString *pUVar2;
  Part *pPVar3;
  int srcStart;
  long lVar4;
  
  pUVar2 = &msgPattern->msg;
  pPVar3 = msgPattern->parts;
  srcStart = (uint)pPVar3[msgStart].length + pPVar3[msgStart].index;
  do {
    lVar4 = (long)msgStart;
    msgStart = msgStart + 1;
    lVar4 = lVar4 + 1;
    UVar1 = pPVar3[lVar4].type;
    start = pPVar3[lVar4].index;
    if (UVar1 == UMSGPAT_PART_TYPE_SKIP_SYNTAX) {
      icu_63::UnicodeString::doAppend(result,pUVar2,srcStart,start - srcStart);
      srcStart = (uint)pPVar3[lVar4].length + pPVar3[lVar4].index;
    }
    else if (UVar1 == UMSGPAT_PART_TYPE_ARG_START) {
      icu_63::UnicodeString::doAppend(result,pUVar2,srcStart,start - srcStart);
      pPVar3 = msgPattern->parts;
      if (msgStart < pPVar3[lVar4].limitPartIndex) {
        msgStart = pPVar3[lVar4].limitPartIndex;
      }
      srcStart = (uint)pPVar3[msgStart].length + pPVar3[msgStart].index;
      appendReducedApostrophes(pUVar2,start,srcStart,result);
    }
    else if (UVar1 == UMSGPAT_PART_TYPE_MSG_LIMIT) {
      pUVar2 = icu_63::UnicodeString::doAppend(result,pUVar2,srcStart,start - srcStart);
      return pUVar2;
    }
    pPVar3 = msgPattern->parts;
  } while( true );
}

Assistant:

UnicodeString &
MessageImpl::appendSubMessageWithoutSkipSyntax(const MessagePattern &msgPattern,
                                               int32_t msgStart,
                                               UnicodeString &result) {
    const UnicodeString &msgString=msgPattern.getPatternString();
    int32_t prevIndex=msgPattern.getPart(msgStart).getLimit();
    for(int32_t i=msgStart;;) {
        const MessagePattern::Part &part=msgPattern.getPart(++i);
        UMessagePatternPartType type=part.getType();
        int32_t index=part.getIndex();
        if(type==UMSGPAT_PART_TYPE_MSG_LIMIT) {
            return result.append(msgString, prevIndex, index-prevIndex);
        } else if(type==UMSGPAT_PART_TYPE_SKIP_SYNTAX) {
            result.append(msgString, prevIndex, index-prevIndex);
            prevIndex=part.getLimit();
        } else if(type==UMSGPAT_PART_TYPE_ARG_START) {
            result.append(msgString, prevIndex, index-prevIndex);
            prevIndex=index;
            i=msgPattern.getLimitPartIndex(i);
            index=msgPattern.getPart(i).getLimit();
            appendReducedApostrophes(msgString, prevIndex, index, result);
            prevIndex=index;
        }
    }
}